

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool __thiscall TestRunMultiple::Run(TestRunMultiple *this)

{
  Results rs;
  TestRunMultipleInternal test1;
  TestRunMultipleInternal test0;
  ostringstream oss;
  TestRegistry r;
  string sStack_16b8;
  TestRunMultipleInternal local_1698;
  RunParams local_1650;
  TestRunMultipleInternal local_1638;
  ostringstream local_15f0 [376];
  TestRegistry local_1478;
  
  testinator::TestRegistry::TestRegistry(&local_1478);
  std::__cxx11::ostringstream::ostringstream(local_15f0);
  std::make_unique<testinator::DefaultOutputter,std::__cxx11::ostringstream&>
            ((basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1638
            );
  std::__cxx11::string::string((string *)&local_1698,"test0",(allocator *)&sStack_16b8);
  TestRunMultipleInternal::TestRunMultipleInternal(&local_1638,&local_1478,(string *)&local_1698);
  std::__cxx11::string::~string((string *)&local_1698);
  std::__cxx11::string::string((string *)&sStack_16b8,"test1",(allocator *)&local_1650);
  TestRunMultipleInternal::TestRunMultipleInternal(&local_1698,&local_1478,&sStack_16b8);
  std::__cxx11::string::~string((string *)&sStack_16b8);
  local_1650.m_flags = 0;
  local_1650._4_4_ = 0;
  local_1650.m_numPropertyChecks = 100;
  local_1650.m_randomSeed = 0;
  testinator::TestRegistry::RunAllTests
            ((Results *)&sStack_16b8,&local_1478,&local_1650,
             (Outputter *)local_1638.super_Test._vptr_Test);
  std::vector<testinator::Result,_std::allocator<testinator::Result>_>::~vector
            ((vector<testinator::Result,_std::allocator<testinator::Result>_> *)&sStack_16b8);
  testinator::Test::~Test(&local_1698.super_Test);
  testinator::Test::~Test(&local_1638.super_Test);
  if ((Outputter *)local_1638.super_Test._vptr_Test != (Outputter *)0x0) {
    (*(*(_func_int ***)local_1638.super_Test._vptr_Test)[8])(local_1638.super_Test._vptr_Test);
  }
  std::__cxx11::ostringstream::~ostringstream(local_15f0);
  testinator::TestRegistry::~TestRegistry(&local_1478);
  return (bool)(local_1638.m_runCalled & local_1698.m_runCalled);
}

Assistant:

virtual bool Run()
  {
    testinator::TestRegistry r;
    ostringstream oss;
    std::unique_ptr<testinator::Outputter> op =
      make_unique<testinator::DefaultOutputter>(oss);

    TestRunMultipleInternal test0(r, "test0");
    TestRunMultipleInternal test1(r, "test1");
    testinator::Results rs = r.RunAllTests(testinator::RunParams(), op.get());
    return test0.m_runCalled && test1.m_runCalled;
  }